

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O0

bool cmAuxSourceDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view sVar1;
  undefined8 uVar2;
  cmExecutionStatus *this;
  bool bVar3;
  size_type sVar4;
  string *psVar5;
  const_reference pvVar6;
  unsigned_long uVar7;
  char *__s;
  cmake *this_00;
  cmSourceFile *this_01;
  ulong uVar8;
  undefined1 auVar9 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  string_view local_2c8;
  string_view local_2b8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  allocator<char> local_271;
  string local_270;
  cmSourceFile *local_250;
  cmSourceFile *sf;
  cmAlphaNum local_218;
  undefined1 local_1e8 [8];
  string fullname;
  cmake *cm;
  char *local_1a8;
  size_t sStack_1a0;
  basic_string_view<char,_std::char_traits<char>_> ext;
  size_type dotpos;
  undefined1 local_180 [8];
  string file;
  size_t i;
  size_t numfiles;
  Directory local_148;
  Directory dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmAlphaNum local_f8;
  string local_c8;
  undefined1 local_a8 [8];
  string tdir;
  string *templateDirectory;
  string sourceListValue;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar4 == 2) {
    sourceListValue.field_2._8_8_ = cmExecutionStatus::GetMakefile(local_20);
    std::__cxx11::string::string((string *)&templateDirectory);
    tdir.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,0);
    std::__cxx11::string::string((string *)local_a8);
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)tdir.field_2._8_8_);
    if (bVar3) {
      std::__cxx11::string::operator=((string *)local_a8,(string *)tdir.field_2._8_8_);
    }
    else {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         ((cmMakefile *)sourceListValue.field_2._8_8_);
      cmAlphaNum::cmAlphaNum(&local_f8,psVar5);
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,'/');
      cmStrCat<std::__cxx11::string>
                (&local_c8,&local_f8,
                 (cmAlphaNum *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 tdir.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_a8,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    uVar2 = sourceListValue.field_2._8_8_;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    psVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,pvVar6);
    std::__cxx11::string::operator=((string *)&templateDirectory,(string *)psVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dir);
    cmsys::Directory::Directory(&local_148);
    numfiles = (size_t)cmsys::Directory::Load(&local_148,(string *)local_a8,(string *)0x0);
    bVar3 = cmsys::Status::operator_cast_to_bool((Status *)&numfiles);
    if (bVar3) {
      uVar7 = cmsys::Directory::GetNumberOfFiles(&local_148);
      for (file.field_2._8_8_ = 0; (ulong)file.field_2._8_8_ < uVar7;
          file.field_2._8_8_ = file.field_2._8_8_ + 1) {
        __s = cmsys::Directory::GetFile(&local_148,file.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_180,__s,(allocator<char> *)((long)&dotpos + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&dotpos + 7));
        ext._M_str = (char *)std::__cxx11::string::rfind((char)local_180,0x2e);
        if (ext._M_str != (char *)0xffffffffffffffff) {
          auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_180);
          local_1a8 = auVar9._8_8_;
          cm = auVar9._0_8_;
          bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&cm,
                              (size_type)(ext._M_str + 1),0xffffffffffffffff);
          ext._M_len = (size_t)bVar10._M_str;
          sStack_1a0 = bVar10._M_len;
          this_00 = cmMakefile::GetCMakeInstance((cmMakefile *)sourceListValue.field_2._8_8_);
          if (ext._M_str != (char *)0x0) {
            fullname.field_2._8_8_ = sStack_1a0;
            sVar1._M_str = (char *)ext._M_len;
            sVar1._M_len = sStack_1a0;
            bVar3 = cmake::IsACLikeSourceExtension(this_00,sVar1);
            if (bVar3) {
              cmAlphaNum::cmAlphaNum(&local_218,(string *)tdir.field_2._8_8_);
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sf,'/');
              cmStrCat<std::__cxx11::string>
                        ((string *)local_1e8,&local_218,(cmAlphaNum *)&sf,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_180);
              this_01 = cmMakefile::GetOrCreateSource
                                  ((cmMakefile *)sourceListValue.field_2._8_8_,(string *)local_1e8,
                                   false,Ambiguous);
              local_250 = this_01;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_270,"ABSTRACT",&local_271);
              cmSourceFile::SetProperty(this_01,&local_270,"0");
              std::__cxx11::string::~string((string *)&local_270);
              std::allocator<char>::~allocator(&local_271);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&dir,(value_type *)local_1e8);
              std::__cxx11::string::~string((string *)local_1e8);
            }
          }
        }
        std::__cxx11::string::~string((string *)local_180);
      }
    }
    local_280._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dir);
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dir);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_280,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_288);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&templateDirectory,";");
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b8,";");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2c8);
    cmJoin(&local_2a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&dir,local_2b8,local_2c8);
    std::__cxx11::string::operator+=((string *)&templateDirectory,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    uVar2 = sourceListValue.field_2._8_8_;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&templateDirectory);
    cmMakefile::AddDefinition((cmMakefile *)uVar2,pvVar6,sVar1);
    args_local._7_1_ = 1;
    cmsys::Directory::~Directory(&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dir);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&templateDirectory);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmAuxSourceDirectoryCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.size() != 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string sourceListValue;
  std::string const& templateDirectory = args[0];
  std::string tdir;
  if (!cmSystemTools::FileIsFullPath(templateDirectory)) {
    tdir = cmStrCat(mf.GetCurrentSourceDirectory(), '/', templateDirectory);
  } else {
    tdir = templateDirectory;
  }

  // was the list already populated
  sourceListValue = mf.GetSafeDefinition(args[1]);

  std::vector<std::string> files;

  // Load all the files in the directory
  cmsys::Directory dir;
  if (dir.Load(tdir)) {
    size_t numfiles = dir.GetNumberOfFiles();
    for (size_t i = 0; i < numfiles; ++i) {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind('.');
      if (dotpos != std::string::npos) {
        auto ext = cm::string_view(file).substr(dotpos + 1);
        // Process only source files
        auto* cm = mf.GetCMakeInstance();
        if (dotpos > 0 && cm->IsACLikeSourceExtension(ext)) {
          std::string fullname = cmStrCat(templateDirectory, '/', file);
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf = mf.GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT", "0");
          files.push_back(std::move(fullname));
        }
      }
    }
  }
  std::sort(files.begin(), files.end());
  if (!sourceListValue.empty()) {
    sourceListValue += ";";
  }
  sourceListValue += cmJoin(files, ";");
  mf.AddDefinition(args[1], sourceListValue);
  return true;
}